

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::CompExp(SQCompiler *this)

{
  long lVar1;
  SQCompiler *this_local;
  
  ShiftExp(this);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (lVar1 = this->_token, lVar1 == 0x3c) {
              BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1234b0,0);
            }
            if (lVar1 != 0x3e) break;
            BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1234b0,0);
          }
          if (lVar1 != 0x10a) break;
          BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1234b0,0);
        }
        if (lVar1 != 0x10b) break;
        BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1234b0,0);
      }
      if (lVar1 != 0x118) break;
      BIN_EXP<void(SQCompiler::*)()>(this,_OP_EXISTS,0x1234b0,0);
    }
    if (lVar1 != 0x137) break;
    BIN_EXP<void(SQCompiler::*)()>(this,_OP_INSTANCEOF,0x1234b0,0);
  }
  return;
}

Assistant:

void CompExp()
    {
        ShiftExp();
        for(;;) switch(_token) {
        case _SC('>'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_G); break;
        case _SC('<'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_L); break;
        case TK_GE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_GE); break;
        case TK_LE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_LE); break;
        case TK_IN: BIN_EXP(_OP_EXISTS, &SQCompiler::ShiftExp); break;
        case TK_INSTANCEOF: BIN_EXP(_OP_INSTANCEOF, &SQCompiler::ShiftExp); break;
        default: return;
        }
    }